

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlChar * xmlXPathParseLiteral(xmlXPathParserContextPtr ctxt)

{
  xmlChar xVar1;
  xmlChar *cur;
  xmlChar *pxVar2;
  bool bVar3;
  uint uVar4;
  xmlChar *pxVar5;
  xmlChar xVar6;
  int code;
  int len;
  int local_2c;
  
  xVar1 = *ctxt->cur;
  xVar6 = xVar1;
  if (xVar1 != '\"') {
    if (xVar1 != '\'') {
      code = 3;
LAB_001c91e1:
      xmlXPathErr(ctxt,code);
      return (xmlChar *)0x0;
    }
    xVar6 = '\'';
  }
  if (xVar1 != '\0') {
    ctxt->cur = ctxt->cur + 1;
  }
  cur = ctxt->cur;
  pxVar5 = cur;
  if (xVar6 != *cur) {
    do {
      local_2c = 4;
      if (*pxVar5 == '\0') {
        code = 2;
        goto LAB_001c91e1;
      }
      uVar4 = xmlGetUTF8Char(pxVar5,&local_2c);
      code = 0x15;
      if ((int)uVar4 < 0) goto LAB_001c91e1;
      if ((int)uVar4 < 0x100) {
        if ((0xd < uVar4) || ((0x2600U >> (uVar4 & 0x1f) & 1) == 0)) {
          bVar3 = 0x1f < (int)uVar4;
          goto LAB_001c9185;
        }
      }
      else {
        bVar3 = (uVar4 - 0x10000 < 0x100000 || uVar4 - 0xe000 < 0x1ffe) || (int)uVar4 < 0xd800;
LAB_001c9185:
        if (!bVar3) goto LAB_001c91e1;
      }
      pxVar2 = ctxt->cur;
      pxVar5 = pxVar2 + local_2c;
      ctxt->cur = pxVar5;
    } while (xVar6 != pxVar2[local_2c]);
  }
  pxVar5 = xmlStrndup(cur,(int)pxVar5 - (int)cur);
  if (pxVar5 == (xmlChar *)0x0) {
    xmlXPathPErrMemory(ctxt);
  }
  if (*ctxt->cur != '\0') {
    ctxt->cur = ctxt->cur + 1;
  }
  return pxVar5;
}

Assistant:

static xmlChar *
xmlXPathParseLiteral(xmlXPathParserContextPtr ctxt) {
    const xmlChar *q;
    xmlChar *ret = NULL;
    int quote;

    if (CUR == '"') {
        quote = '"';
    } else if (CUR == '\'') {
        quote = '\'';
    } else {
	XP_ERRORNULL(XPATH_START_LITERAL_ERROR);
    }

    NEXT;
    q = CUR_PTR;
    while (CUR != quote) {
        int ch;
        int len = 4;

        if (CUR == 0)
            XP_ERRORNULL(XPATH_UNFINISHED_LITERAL_ERROR);
        ch = xmlGetUTF8Char(CUR_PTR, &len);
        if ((ch < 0) || (IS_CHAR(ch) == 0))
            XP_ERRORNULL(XPATH_INVALID_CHAR_ERROR);
        CUR_PTR += len;
    }
    ret = xmlStrndup(q, CUR_PTR - q);
    if (ret == NULL)
        xmlXPathPErrMemory(ctxt);
    NEXT;
    return(ret);
}